

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferSparseResidency.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::sparse::anon_unknown_0::BufferSparseResidencyInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferSparseResidencyInstance *this)

{
  int *piVar1;
  pointer *ppQVar2;
  Handle<(vk::HandleType)7> vk;
  Handle<(vk::HandleType)7> HVar3;
  VkDevice device;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  QueueRequirements QVar4;
  void *pvVar5;
  VkPipeline obj;
  pointer pQVar6;
  pointer buffer;
  pointer pQVar7;
  pointer commandBuffer;
  pointer descriptorPool;
  pointer pQVar8;
  pointer pQVar9;
  Handle<(vk::HandleType)19> descriptorSetLayout;
  deUint32 memoryType;
  VkResult result;
  int iVar10;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  Queue *pQVar11;
  Queue *pQVar12;
  Handle<(vk::HandleType)7> HVar13;
  Handle<(vk::HandleType)7> *pHVar14;
  size_t __n;
  DescriptorSetLayoutBuilder *pDVar15;
  const_iterator cVar16;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *pDVar17;
  NotSupportedError *pNVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint local_758;
  DescriptorPoolBuilder local_728;
  undefined8 uStack_710;
  QueueRequirementsVec queueRequirements;
  VkCommandPool VStack_6f0;
  VkBool32 local_6e8;
  VkBool32 VStack_6e4;
  pointer local_6e0;
  VkBool32 local_6d8;
  VkBool32 VStack_6d4;
  VkBool32 local_6c8;
  VkBool32 VStack_6c4;
  VkBool32 local_654;
  undefined1 local_628 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  vector<unsigned_char,_std::allocator<unsigned_char>_> referenceData;
  deUint32 queueFamilyIndices [2];
  Move<vk::Handle<(vk::HandleType)19>_> local_5a8;
  VkBuffer local_588;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_580;
  VkBufferCreateInfo outputBufferCreateInfo;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_520;
  VkBuffer local_508;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_500;
  VkBufferCreateInfo inputBufferCreateInfo;
  VkMemoryRequirements bufferMemRequirements;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_490;
  VkSemaphore local_478;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_470;
  VkBufferCreateInfo bufferCreateInfo;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  VkPipelineStageFlags waitStageBits [1];
  undefined4 uStack_3fc;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_3e0;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_3c0;
  VkCommandPool local_3a8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_3a0;
  VkDescriptorBufferInfo sparseBufferInfo;
  VkPhysicalDeviceProperties physicalDeviceProperties;
  
  vk_00 = Context::getInstanceInterface
                    ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceProperties(&physicalDeviceProperties,vk_00,physicalDevice);
  ::vk::getPhysicalDeviceFeatures
            ((VkPhysicalDeviceFeatures *)&queueRequirements,vk_00,physicalDevice);
  if (local_654 == 0) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar18,"Sparse partially resident buffers not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseResidency.cpp"
               ,0x90);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  queueRequirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  bufferCreateInfo._4_4_ = 1;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            (&queueRequirements,(QueueRequirements *)&bufferCreateInfo);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
  bufferCreateInfo._4_4_ = 1;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            (&queueRequirements,(QueueRequirements *)&bufferCreateInfo);
  SparseResourcesBaseInstance::createDeviceSupportingQueues
            (&this->super_SparseResourcesBaseInstance,&queueRequirements);
  if (queueRequirements.
      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(queueRequirements.
                    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)queueRequirements.
                          super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)queueRequirements.
                          super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  vk.m_internal =
       (deUint64)
       (this->super_SparseResourcesBaseInstance).m_deviceDriver.
       super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pQVar11 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0);
  pQVar12 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,2,0);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 3;
  bufferCreateInfo.size = (VkDeviceSize)this->m_bufferSize;
  bufferCreateInfo.usage = 0x21;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  queueFamilyIndices[0] = pQVar11->queueFamilyIndex;
  queueFamilyIndices[1] = pQVar12->queueFamilyIndex;
  if (queueFamilyIndices[0] != queueFamilyIndices[1]) {
    bufferCreateInfo.queueFamilyIndexCount = 2;
    bufferCreateInfo.pQueueFamilyIndices = queueFamilyIndices;
  }
  bufferCreateInfo.sharingMode = (VkSharingMode)(queueFamilyIndices[0] != queueFamilyIndices[1]);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&queueRequirements,
                     (DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  DStack_580.m_device =
       (VkDevice)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_588.m_internal =
       (deUint64)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_start;
  DStack_580.m_deviceIface =
       (DeviceInterface *)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&queueRequirements,
             (DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
  DStack_470.m_device =
       (VkDevice)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_478.m_internal =
       (deUint64)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_start;
  DStack_470.m_deviceIface =
       (DeviceInterface *)
       queueRequirements.
       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::getBufferMemoryRequirements
            (&bufferMemRequirements,(DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,local_588);
  if (physicalDeviceProperties.limits.sparseAddressSpaceSize < bufferMemRequirements.size) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar18,"Required memory size for sparse resources exceeds device limits",(char *)0x0
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseResidency.cpp"
               ,0xbf);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar20 = CONCAT44(bufferMemRequirements.alignment._4_4_,(uint)bufferMemRequirements.alignment);
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inputBufferCreateInfo.flags = 0;
  inputBufferCreateInfo._20_4_ = 0;
  inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputBufferCreateInfo._4_4_ = 0;
  inputBufferCreateInfo.pNext = (void *)0x0;
  memoryType = findMatchingMemoryType
                         (vk_00,physicalDevice,&bufferMemRequirements,
                          (MemoryRequirement *)&::vk::MemoryRequirement::Any);
  local_758 = (uint)(bufferMemRequirements.size / uVar20);
  if (memoryType == 0xffffffff) {
    ppQVar2 = &queueRequirements.
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppQVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&queueRequirements,"No matching memory type found","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               queueRequirements.
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (long)&(queueRequirements.
                       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->queueFlags +
               (long)queueRequirements.
                     super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    if (queueRequirements.
        super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppQVar2) {
      operator_delete(queueRequirements.
                      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&(queueRequirements.
                                      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     queueFlags + 1));
    }
  }
  else {
    if (local_758 != 0) {
      uVar22 = 0;
      do {
        makeSparseMemoryBind
                  ((VkSparseMemoryBind *)&queueRequirements,(DeviceInterface *)vk.m_internal,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   CONCAT44(bufferMemRequirements.alignment._4_4_,
                            (uint)bufferMemRequirements.alignment),memoryType,
                   (ulong)uVar22 *
                   CONCAT44(bufferMemRequirements.alignment._4_4_,
                            (uint)bufferMemRequirements.alignment));
        HVar13.m_internal =
             (deUint64)
             ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                       ((Handle<(vk::HandleType)7>)
                        queueRequirements.
                        super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        HVar3.m_internal =
             (deUint64)
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object;
        pHVar14 = (Handle<(vk::HandleType)7> *)operator_new(0x20);
        pHVar14[2].m_internal = HVar3.m_internal;
        pHVar14[3].m_internal = 0;
        pHVar14->m_internal = HVar13.m_internal;
        pHVar14[1].m_internal = vk.m_internal;
        outputBufferCreateInfo.pNext = (void *)0x0;
        outputBufferCreateInfo._0_8_ = pHVar14;
        outputBufferCreateInfo.pNext = operator_new(0x20);
        *(undefined4 *)((long)outputBufferCreateInfo.pNext + 8) = 0;
        *(undefined4 *)((long)outputBufferCreateInfo.pNext + 0xc) = 0;
        *(undefined ***)outputBufferCreateInfo.pNext = &PTR__SharedPtrState_00d53420;
        *(Handle<(vk::HandleType)7> **)((long)outputBufferCreateInfo.pNext + 0x10) = pHVar14;
        *(undefined4 *)((long)outputBufferCreateInfo.pNext + 8) = 1;
        *(undefined4 *)((long)outputBufferCreateInfo.pNext + 0xc) = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                    *)&deviceMemUniquePtrVec,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                   &outputBufferCreateInfo);
        if (outputBufferCreateInfo.pNext != (void *)0x0) {
          LOCK();
          piVar1 = (int *)((long)outputBufferCreateInfo.pNext + 8);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
            outputBufferCreateInfo._4_4_ = 0;
            (**(code **)(*outputBufferCreateInfo.pNext + 0x10))();
          }
          LOCK();
          piVar1 = (int *)((long)outputBufferCreateInfo.pNext + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (outputBufferCreateInfo.pNext != (void *)0x0) {
              (**(code **)(*outputBufferCreateInfo.pNext + 8))();
            }
            outputBufferCreateInfo.pNext = (void *)0x0;
          }
        }
        if (inputBufferCreateInfo.pNext == (void *)inputBufferCreateInfo._16_8_) {
          std::vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>::
          _M_realloc_insert<vk::VkSparseMemoryBind_const&>
                    ((vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>> *)
                     &inputBufferCreateInfo,(iterator)inputBufferCreateInfo.pNext,
                     (VkSparseMemoryBind *)&queueRequirements);
        }
        else {
          *(ulong *)((long)inputBufferCreateInfo.pNext + 0x20) = CONCAT44(VStack_6e4,local_6e8);
          *(pointer *)((long)inputBufferCreateInfo.pNext + 0x10) =
               queueRequirements.
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(deUint64 *)((long)inputBufferCreateInfo.pNext + 0x18) = VStack_6f0.m_internal;
          *(pointer *)inputBufferCreateInfo.pNext =
               queueRequirements.
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)((long)inputBufferCreateInfo.pNext + 8) =
               queueRequirements.
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          inputBufferCreateInfo.pNext = (void *)((long)inputBufferCreateInfo.pNext + 0x28);
        }
        uVar22 = uVar22 + 2;
      } while (uVar22 < local_758);
    }
    local_6e0 = (pointer)&outputBufferCreateInfo;
    outputBufferCreateInfo._0_8_ = local_588.m_internal;
    outputBufferCreateInfo.pNext =
         (void *)CONCAT44(outputBufferCreateInfo.pNext._4_4_,
                          (int)((ulong)((long)inputBufferCreateInfo.pNext -
                                       inputBufferCreateInfo._0_8_) >> 3) * -0x33333333);
    outputBufferCreateInfo.flags = inputBufferCreateInfo.sType;
    outputBufferCreateInfo._20_4_ = inputBufferCreateInfo._4_4_;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(queueRequirements.
                           super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,7);
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)queueRequirements.
                          super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
    VStack_6f0.m_internal = 0;
    local_6d8 = 0;
    local_6c8 = 0;
    result = (*(*(_func_int ***)vk.m_internal)[0x11])(vk.m_internal,pQVar11->queueHandle);
    ::vk::checkResult(result,
                      "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseResidency.cpp"
                      ,0xe8);
  }
  if (inputBufferCreateInfo._0_8_ != 0) {
    operator_delete((void *)inputBufferCreateInfo._0_8_,
                    inputBufferCreateInfo._16_8_ - inputBufferCreateInfo._0_8_);
  }
  if (memoryType != 0xffffffff) {
    makeBufferCreateInfo(&inputBufferCreateInfo,(ulong)this->m_bufferSize,0x20);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&queueRequirements,
                       (DeviceInterface *)vk.m_internal,
                       (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                       super_RefBase<vk::VkDevice_s_*>.m_data.object,&inputBufferCreateInfo,
                       (VkAllocationCallbacks *)0x0);
    DStack_500.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    DStack_500.m_allocator = (VkAllocationCallbacks *)VStack_6f0.m_internal;
    local_508.m_internal =
         (deUint64)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    DStack_500.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&queueRequirements,
               (DeviceInterface *)vk.m_internal,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (this->super_SparseResourcesBaseInstance).m_allocator.
               super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
               (VkBuffer)
               queueRequirements.
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               ._M_impl.super__Vector_impl_data._M_start,(MemoryRequirement)0x1);
    pQVar6 = queueRequirements.
             super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             ._M_impl.super__Vector_impl_data._M_start;
    referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&referenceData,(ulong)this->m_bufferSize);
    __n = (size_t)this->m_bufferSize;
    if (this->m_bufferSize != 0) {
      uVar20 = 0;
      do {
        referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar20] =
             (char)(uVar20 % CONCAT44(bufferMemRequirements.alignment._4_4_,
                                      (uint)bufferMemRequirements.alignment)) + '\x01';
        uVar20 = uVar20 + 1;
        __n = (size_t)this->m_bufferSize;
      } while (uVar20 < __n);
    }
    memcpy((void *)pQVar6[3],
           referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,__n);
    ::vk::flushMappedMemoryRange
              ((DeviceInterface *)vk.m_internal,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkDeviceMemory)pQVar6[1],
               (VkDeviceSize)pQVar6[2],(ulong)this->m_bufferSize);
    makeBufferCreateInfo(&outputBufferCreateInfo,(ulong)this->m_bufferSize,2);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&queueRequirements,
                       (DeviceInterface *)vk.m_internal,
                       (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                       super_RefBase<vk::VkDevice_s_*>.m_data.object,&outputBufferCreateInfo,
                       (VkAllocationCallbacks *)0x0);
    buffer = queueRequirements.
             super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             ._M_impl.super__Vector_impl_data._M_start;
    DStack_520.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    DStack_520.m_allocator = (VkAllocationCallbacks *)VStack_6f0.m_internal;
    DStack_520.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&queueRequirements,
               (DeviceInterface *)vk.m_internal,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (this->super_SparseResourcesBaseInstance).m_allocator.
               super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
               (VkBuffer)
               queueRequirements.
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               ._M_impl.super__Vector_impl_data._M_start,(MemoryRequirement)0x1);
    pQVar7 = queueRequirements.
             super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             ._M_impl.super__Vector_impl_data._M_start;
    makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&queueRequirements,
                    (DeviceInterface *)vk.m_internal,
                    (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                    super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar12->queueFamilyIndex);
    DStack_3a0.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    DStack_3a0.m_allocator = (VkAllocationCallbacks *)VStack_6f0.m_internal;
    local_3a8.m_internal =
         (deUint64)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    DStack_3a0.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)&queueRequirements,(DeviceInterface *)vk.m_internal,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkCommandPool)
               queueRequirements.
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               ._M_impl.super__Vector_impl_data._M_start,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    pQVar9 = queueRequirements.
             super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pQVar8 = queueRequirements.
             super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    commandBuffer =
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    beginCommandBuffer((DeviceInterface *)vk.m_internal,
                       (VkCommandBuffer)
                       queueRequirements.
                       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)&queueRequirements);
    pDVar15 = ::vk::DescriptorSetLayoutBuilder::addBinding
                        ((DescriptorSetLayoutBuilder *)&queueRequirements,
                         VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
    pDVar15 = ::vk::DescriptorSetLayoutBuilder::addBinding
                        (pDVar15,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
    ::vk::DescriptorSetLayoutBuilder::build
              (&local_5a8,pDVar15,(DeviceInterface *)vk.m_internal,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,0);
    descriptorSetLayout.m_internal =
         local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
    DStack_490.m_device =
         local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
    DStack_490.m_allocator =
         local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
    DStack_490.m_deviceIface =
         local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
    local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
    local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pvVar5 = (void *)CONCAT44(VStack_6d4,local_6d8);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,CONCAT44(VStack_6c4,local_6c8) - (long)pvVar5);
    }
    if ((VkAllocationCallbacks *)VStack_6f0.m_internal != (VkAllocationCallbacks *)0x0) {
      operator_delete((void *)VStack_6f0.m_internal,(long)local_6e0 - VStack_6f0.m_internal);
    }
    if (queueRequirements.
        super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(queueRequirements.
                      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)queueRequirements.
                            super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)queueRequirements.
                            super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    device = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object;
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               *)((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context)->
                 m_progCollection;
    local_628._0_8_ = &local_618;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"comp","");
    cVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(this_00,(key_type *)local_628);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&queueRequirements,
               (DeviceInterface *)vk.m_internal,device,*(ProgramBinary **)(cVar16._M_node + 2),0);
    local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_6f0.m_internal;
    local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal =
         (deUint64)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._0_8_ != &local_618) {
      operator_delete((void *)local_628._0_8_,(ulong)(local_618._M_allocated_capacity + 1));
    }
    makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&queueRequirements,
                       (DeviceInterface *)vk.m_internal,
                       (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                       super_RefBase<vk::VkDevice_s_*>.m_data.object,
                       (VkDescriptorSetLayout)descriptorSetLayout.m_internal);
    local_618._M_allocated_capacity =
         (size_type)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_618._8_8_ = 0;
    local_628._0_8_ =
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_628._8_8_ =
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&queueRequirements,
                        (DeviceInterface *)vk.m_internal,
                        (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                        super_RefBase<vk::VkDevice_s_*>.m_data.object,
                        (VkPipelineLayout)
                        queueRequirements.
                        super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (VkShaderModule)
                        local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                        m_internal,(VkSpecializationInfo *)0x0);
    DStack_3c0.m_device._0_4_ =
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
    DStack_3c0.m_device._4_4_ =
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    DStack_3c0.m_allocator._0_4_ = 0;
    DStack_3c0.m_allocator._4_4_ = 0;
    local_3c8 = queueRequirements.
                super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_;
    uStack_3c4 = queueRequirements.
                 super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_;
    DStack_3c0.m_deviceIface._0_4_ =
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    DStack_3c0.m_deviceIface._4_4_ =
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    (*(*(_func_int ***)vk.m_internal)[0x4c])
              (vk.m_internal,commandBuffer,1,
               queueRequirements.
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               ._M_impl.super__Vector_impl_data._M_start);
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_728);
    this_01 = ::vk::DescriptorPoolBuilder::addType(&local_728,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
    ::vk::DescriptorPoolBuilder::build
              ((Move<vk::Handle<(vk::HandleType)21>_> *)&queueRequirements,this_01,
               (DeviceInterface *)vk.m_internal,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,1,1);
    descriptorPool =
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_start;
    DStack_3e0.m_device =
         (VkDevice)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    DStack_3e0.m_allocator = (VkAllocationCallbacks *)0x0;
    DStack_3e0.m_deviceIface =
         (DeviceInterface *)
         queueRequirements.
         super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((pointer)local_728.m_counts.
                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_728.m_counts.
                      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_728.m_counts.
                            super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_728.m_counts.
                            super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&queueRequirements,
                      (DeviceInterface *)vk.m_internal,
                      (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                      super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkDescriptorPool)descriptorPool
                      ,(VkDescriptorSetLayout)descriptorSetLayout.m_internal);
    local_728.m_counts.
    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)queueRequirements.
                  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    uStack_710 = 0;
    local_728.m_counts.
    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)queueRequirements.
                  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_728.m_counts.
    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)queueRequirements.
                  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    sparseBufferInfo.range = (VkDeviceSize)this->m_bufferSize;
    _waitStageBits = (pointer)local_508.m_internal;
    sparseBufferInfo.buffer.m_internal = local_588.m_internal;
    sparseBufferInfo.offset = 0;
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)&queueRequirements);
    pDVar17 = (DescriptorSetUpdateBuilder *)
              ::vk::DescriptorSetUpdateBuilder::write
                        ((DescriptorSetUpdateBuilder *)&queueRequirements,
                         (int)local_728.m_counts.
                              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                              ._M_impl.super__Vector_impl_data._M_start,(void *)0x0,0);
    pDVar17 = (DescriptorSetUpdateBuilder *)
              ::vk::DescriptorSetUpdateBuilder::write
                        (pDVar17,(int)local_728.m_counts.
                                      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                      ._M_impl.super__Vector_impl_data._M_start,&DAT_00000001,0);
    ::vk::DescriptorSetUpdateBuilder::update
              (pDVar17,(DeviceInterface *)vk.m_internal,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object);
    pvVar5 = (void *)CONCAT44(VStack_6d4,local_6d8);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,CONCAT44(VStack_6c4,local_6c8) - (long)pvVar5);
    }
    std::
    vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
    ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
               *)&queueRequirements);
    (*(*(_func_int ***)vk.m_internal)[0x56])
              (vk.m_internal,commandBuffer,1,local_628._0_8_,0,1,&local_728,0,0);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&queueRequirements,0x4000,0x20,local_508,0,
               (ulong)this->m_bufferSize);
    (*(*(_func_int ***)vk.m_internal)[0x6d])
              (vk.m_internal,commandBuffer,0x4000,0x800,0,0,0,1,
               (VkBufferMemoryBarrier *)&queueRequirements,0,0);
    (*(*(_func_int ***)vk.m_internal)[0x5d])(vk.m_internal,commandBuffer,1,1);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&queueRequirements,0x40,0x800,local_588,0,
               (ulong)this->m_bufferSize);
    (*(*(_func_int ***)vk.m_internal)[0x6d])
              (vk.m_internal,commandBuffer,0x800,0x1000,0,0,0,1,
               (VkBufferMemoryBarrier *)&queueRequirements,0,0);
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)this->m_bufferSize;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (*(*(_func_int ***)vk.m_internal)[0x5f])
              (vk.m_internal,commandBuffer,local_588.m_internal,buffer);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&queueRequirements,0x1000,0x2000,(VkBuffer)buffer,0,
               (ulong)this->m_bufferSize);
    (*(*(_func_int ***)vk.m_internal)[0x6d])
              (vk.m_internal,commandBuffer,0x1000,0x4000,0,0,0,1,
               (VkBufferMemoryBarrier *)&queueRequirements,0,0);
    endCommandBuffer((DeviceInterface *)vk.m_internal,(VkCommandBuffer)commandBuffer);
    _waitStageBits = (pointer)CONCAT44(uStack_3fc,0x1000);
    submitCommandsAndWait
              ((DeviceInterface *)vk.m_internal,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar12->queueHandle,
               (VkCommandBuffer)commandBuffer,1,&local_478,waitStageBits,0,(VkSemaphore *)0x0);
    ::vk::invalidateMappedMemoryRange
              ((DeviceInterface *)vk.m_internal,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkDeviceMemory)pQVar7[1],
               (VkDeviceSize)pQVar7[2],(ulong)this->m_bufferSize);
    QVar4 = pQVar7[3];
    (*(*(_func_int ***)vk.m_internal)[3])(vk.m_internal);
    if (local_758 != 0) {
      uVar22 = 0;
      do {
        uVar21 = (uint)bufferMemRequirements.alignment;
        if (local_758 - 1 == uVar22) {
          uVar21 = this->m_bufferSize % (uint)bufferMemRequirements.alignment;
        }
        uVar19 = (uint)bufferMemRequirements.alignment * uVar22;
        if ((uVar22 & 1) == 0) {
          iVar10 = bcmp(referenceData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar19,
                        (void *)((ulong)uVar19 + (long)QVar4),(ulong)uVar21);
          if (iVar10 != 0) {
            queueRequirements.
            super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&queueRequirements.
                           super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&queueRequirements,"Failed","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->m_description,
                       queueRequirements.
                       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (long)&(queueRequirements.
                               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->queueFlags +
                       (long)queueRequirements.
                             super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                             ._M_impl.super__Vector_impl_data._M_start);
LAB_007906a7:
            if (queueRequirements.
                super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&queueRequirements.
                          super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(queueRequirements.
                              super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)&(queueRequirements.
                                              super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             queueFlags + 1));
            }
            goto LAB_007906c6;
          }
        }
        else if (physicalDeviceProperties.sparseProperties.residencyNonResidentStrict != 0) {
          uVar20 = (ulong)uVar19;
          memset(referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar20,0,(ulong)uVar21);
          iVar10 = bcmp(referenceData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar20,(void *)(uVar20 + (long)QVar4),
                        (ulong)uVar21);
          if (iVar10 != 0) {
            queueRequirements.
            super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&queueRequirements.
                           super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&queueRequirements,"Failed","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->m_description,
                       queueRequirements.
                       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (long)&(queueRequirements.
                               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->queueFlags +
                       (long)queueRequirements.
                             super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                             ._M_impl.super__Vector_impl_data._M_start);
            goto LAB_007906a7;
          }
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < local_758);
    }
    ppQVar2 = &queueRequirements.
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    queueRequirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppQVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&queueRequirements,"Passed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               queueRequirements.
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (long)&(queueRequirements.
                       super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->queueFlags +
               (long)queueRequirements.
                     super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    if (queueRequirements.
        super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppQVar2) {
      operator_delete(queueRequirements.
                      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&(queueRequirements.
                                      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     queueFlags + 1));
    }
LAB_007906c6:
    if ((pointer)local_728.m_counts.
                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      queueRequirements.
      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_728.m_counts.
                    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      (**(code **)((long)*(QueueRequirements *)
                          local_728.m_counts.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x1e8))
                (local_728.m_counts.
                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_728.m_counts.
                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,uStack_710,1);
    }
    if (descriptorPool != (pointer)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                (&DStack_3e0,(VkDescriptorPool)descriptorPool);
    }
    obj.m_internal._4_4_ = uStack_3c4;
    obj.m_internal._0_4_ = local_3c8;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_3c0,obj);
    }
    if ((pointer)local_628._0_8_ != (pointer)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_628 + 8),
                 (VkPipelineLayout)local_628._0_8_);
    }
    if (local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
                 &local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
                 (VkShaderModule)
                 local_5a8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
    }
    if (descriptorSetLayout.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&DStack_490,(VkDescriptorSetLayout)descriptorSetLayout.m_internal);
    }
    if (commandBuffer != (pointer)0x0) {
      queueRequirements.
      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      ._M_impl.super__Vector_impl_data._M_start = commandBuffer;
      (**(code **)((long)*pQVar8 + 0x240))(pQVar8,pQVar9,VStack_6f0.m_internal,1);
    }
    if (local_3a8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_3a0,local_3a8);
    }
    if (pQVar7 != (pointer)0x0) {
      (**(code **)((long)*pQVar7 + 8))(pQVar7);
    }
    if (buffer != (pointer)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&DStack_520,(VkBuffer)buffer);
    }
    if (referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(referenceData.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)referenceData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)referenceData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (pQVar6 != (pointer)0x0) {
      (**(code **)((long)*pQVar6 + 8))(pQVar6);
    }
    if (local_508.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_500,local_508);
    }
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::~vector(&deviceMemUniquePtrVec);
  if (local_478.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()(&DStack_470,local_478);
  }
  if (local_588.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_580,local_588);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferSparseResidencyInstance::iterate (void)
{
	const InstanceInterface&		 instance					= m_context.getInstanceInterface();
	const VkPhysicalDevice			 physicalDevice				= m_context.getPhysicalDevice();
	const VkPhysicalDeviceProperties physicalDeviceProperties	= getPhysicalDeviceProperties(instance, physicalDevice);

	if (!getPhysicalDeviceFeatures(instance, physicalDevice).sparseResidencyBuffer)
		TCU_THROW(NotSupportedError, "Sparse partially resident buffers not supported");

	{
		// Create logical device supporting both sparse and compute operations
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	VkBufferCreateInfo bufferCreateInfo =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// VkStructureType		sType;
		DE_NULL,								// const void*			pNext;
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT |
		VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT,	// VkBufferCreateFlags	flags;
		m_bufferSize,							// VkDeviceSize			size;
		VK_BUFFER_USAGE_STORAGE_BUFFER_BIT |
		VK_BUFFER_USAGE_TRANSFER_SRC_BIT,		// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode		sharingMode;
		0u,										// deUint32				queueFamilyIndexCount;
		DE_NULL									// const deUint32*		pQueueFamilyIndices;
	};

	const deUint32 queueFamilyIndices[] = { sparseQueue.queueFamilyIndex, computeQueue.queueFamilyIndex };

	if (sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex)
	{
		bufferCreateInfo.sharingMode			= VK_SHARING_MODE_CONCURRENT;
		bufferCreateInfo.queueFamilyIndexCount	= 2u;
		bufferCreateInfo.pQueueFamilyIndices	= queueFamilyIndices;
	}

	// Create sparse buffer
	const Unique<VkBuffer> sparseBuffer(createBuffer(deviceInterface, getDevice(), &bufferCreateInfo));

	// Create sparse buffer memory bind semaphore
	const Unique<VkSemaphore> bufferMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	const VkMemoryRequirements bufferMemRequirements = getBufferMemoryRequirements(deviceInterface, getDevice(), *sparseBuffer);

	if (bufferMemRequirements.size > physicalDeviceProperties.limits.sparseAddressSpaceSize)
		TCU_THROW(NotSupportedError, "Required memory size for sparse resources exceeds device limits");

	DE_ASSERT((bufferMemRequirements.size % bufferMemRequirements.alignment) == 0);

	const deUint32				numSparseSlots = static_cast<deUint32>(bufferMemRequirements.size / bufferMemRequirements.alignment);
	std::vector<DeviceMemorySp>	deviceMemUniquePtrVec;

	{
		std::vector<VkSparseMemoryBind>		sparseMemoryBinds;
		const deUint32						memoryType		= findMatchingMemoryType(instance, physicalDevice, bufferMemRequirements, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseSlots; sparseBindNdx += 2)
		{
			const VkSparseMemoryBind sparseMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(), bufferMemRequirements.alignment, memoryType, bufferMemRequirements.alignment * sparseBindNdx);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(sparseMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			sparseMemoryBinds.push_back(sparseMemoryBind);
		}

		const VkSparseBufferMemoryBindInfo sparseBufferBindInfo = makeSparseBufferMemoryBindInfo(*sparseBuffer, static_cast<deUint32>(sparseMemoryBinds.size()), &sparseMemoryBinds[0]);

		const VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			1u,											//deUint32									bufferBindCount;
			&sparseBufferBindInfo,						//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&bufferMemoryBindSemaphore.get()			//const VkSemaphore*						pSignalSemaphores;
		};

		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create input buffer
	const VkBufferCreateInfo		inputBufferCreateInfo	= makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
	const Unique<VkBuffer>			inputBuffer				(createBuffer(deviceInterface, getDevice(), &inputBufferCreateInfo));
	const de::UniquePtr<Allocation>	inputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *inputBuffer, MemoryRequirement::HostVisible));


	std::vector<deUint8> referenceData;
	referenceData.resize(m_bufferSize);

	for (deUint32 valueNdx = 0; valueNdx < m_bufferSize; ++valueNdx)
	{
		referenceData[valueNdx] = static_cast<deUint8>((valueNdx % bufferMemRequirements.alignment) + 1u);
	}

	deMemcpy(inputBufferAlloc->getHostPtr(), &referenceData[0], m_bufferSize);

	flushMappedMemoryRange(deviceInterface, getDevice(), inputBufferAlloc->getMemory(), inputBufferAlloc->getOffset(), m_bufferSize);

	// Create output buffer
	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	// Create command buffer for compute and data transfer oparations
	const Unique<VkCommandPool>	  commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer> commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording compute and transfer commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	// Create descriptor set
	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(deviceInterface, getDevice()));

	// Create compute pipeline
	const Unique<VkShaderModule>	shaderModule(createShaderModule(deviceInterface, getDevice(), m_context.getBinaryCollection().get("comp"), DE_NULL));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout(deviceInterface, getDevice(), *descriptorSetLayout));
	const Unique<VkPipeline>		computePipeline(makeComputePipeline(deviceInterface, getDevice(), *pipelineLayout, *shaderModule));

	deviceInterface.cmdBindPipeline(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2u)
		.build(deviceInterface, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(deviceInterface, getDevice(), *descriptorPool, *descriptorSetLayout));

	{
		const VkDescriptorBufferInfo inputBufferInfo = makeDescriptorBufferInfo(*inputBuffer, 0ull, m_bufferSize);
		const VkDescriptorBufferInfo sparseBufferInfo = makeDescriptorBufferInfo(*sparseBuffer, 0ull, m_bufferSize);

		DescriptorSetUpdateBuilder()
			.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &inputBufferInfo)
			.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &sparseBufferInfo)
			.update(deviceInterface, getDevice());
	}

	deviceInterface.cmdBindDescriptorSets(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	{
		const VkBufferMemoryBarrier inputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_HOST_WRITE_BIT,
										VK_ACCESS_SHADER_READ_BIT,
										*inputBuffer,
										0ull,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 1u, &inputBufferBarrier, 0u, DE_NULL);
	}

	deviceInterface.cmdDispatch(*commandBuffer, 1u, 1u, 1u);

	{
		const VkBufferMemoryBarrier sparseBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_SHADER_WRITE_BIT,
										VK_ACCESS_TRANSFER_READ_BIT,
										*sparseBuffer,
										0ull,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &sparseBufferBarrier, 0u, DE_NULL);
	}

	{
		const VkBufferCopy bufferCopy = makeBufferCopy(0u, 0u, m_bufferSize);

		deviceInterface.cmdCopyBuffer(*commandBuffer, *sparseBuffer, *outputBuffer, 1u, &bufferCopy);
	}

	{
		const VkBufferMemoryBarrier outputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
										VK_ACCESS_HOST_READ_BIT,
										*outputBuffer,
										0ull,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferBarrier, 0u, DE_NULL);
	}

	// End recording compute and transfer commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	const VkPipelineStageFlags waitStageBits[] = { VK_PIPELINE_STAGE_TRANSFER_BIT };

	// Submit transfer commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &bufferMemoryBindSemaphore.get(), waitStageBits);

	// Retrieve data from output buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), m_bufferSize);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	// Compare output data with reference data
	for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseSlots; ++sparseBindNdx)
	{
		const deUint32 alignment = static_cast<deUint32>(bufferMemRequirements.alignment);
		const deUint32 offset	 = alignment * sparseBindNdx;
		const deUint32 size		 = sparseBindNdx == (numSparseSlots - 1) ? m_bufferSize % alignment : alignment;

		if (sparseBindNdx % 2u == 0u)
		{
			if (deMemCmp(&referenceData[offset], outputData + offset, size) != 0)
				return tcu::TestStatus::fail("Failed");
		}
		else if (physicalDeviceProperties.sparseProperties.residencyNonResidentStrict)
		{
			deMemset(&referenceData[offset], 0u, size);

			if (deMemCmp(&referenceData[offset], outputData + offset, size) != 0)
				return tcu::TestStatus::fail("Failed");
		}
	}

	return tcu::TestStatus::pass("Passed");
}